

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

uint32_t MAFSA_delta(uint32_t *links,uint32_t state,MAFSA_letter label)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = state & 0x7fffffff;
  do {
    uVar1 = links[uVar2];
    if (uVar1 == 0xff000000) {
      return 0;
    }
    uVar2 = uVar2 + 1;
  } while ((MAFSA_letter)(uVar1 >> 0x18) != label);
  return uVar1 & 0xffffff;
}

Assistant:

static uint32_t MAFSA_delta(const uint32_t * links, uint32_t state, MAFSA_letter label)
{
    uint32_t links_begin = node_get_children_start(state);
    uint32_t t = links[links_begin];

    while (!link_is_terminating(t))
    {
        if (link_get_label(t) == label)
        {
            return link_get_link(t);
        }

        t = links[++links_begin];
    }

    return 0;
}